

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O3

int32_t ustrcase_internalToTitle_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *iter,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,Edits *edits,
                  UErrorCode *errorCode)

{
  int srcLimit;
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  uint uVar6;
  UCaseContext *pUVar7;
  UCaseContext *pUVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  UCaseContext *local_98;
  UChar *s;
  UCaseContext local_50;
  
  iVar5 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((~options & 0x600) == 0) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      local_50.start = 0;
      local_50.index = 0;
      local_50.cpLimit = 0;
      local_50.dir = '\0';
      local_50.b1 = '\0';
      local_50.b2 = '\0';
      local_50.b3 = '\0';
      local_50.cpStart = 0;
      local_50.limit = srcLength;
      iVar3 = 0;
      lVar10 = 0x50;
      local_98 = (UCaseContext *)0x0;
      pUVar7 = &local_50;
      local_50.p = src;
      do {
        iVar1 = iVar3;
joined_r0x002ffc70:
        if (srcLength <= iVar1) {
          if (U_ZERO_ERROR < *errorCode) {
            return (int)local_98;
          }
          if (destCapacity < (int)local_98) {
            *errorCode = U_BUFFER_OVERFLOW_ERROR;
            return (int)local_98;
          }
          if (edits == (Edits *)0x0) {
            return (int)local_98;
          }
          icu_63::Edits::copyErrorTo(edits,errorCode);
          return (int)local_98;
        }
        iVar3 = (**(code **)((long)(iter->super_UObject)._vptr_UObject + lVar10))(iter);
        srcLimit = srcLength;
        if (iVar3 < srcLength) {
          srcLimit = iVar3;
        }
        if (iVar3 == -1) {
          srcLimit = srcLength;
        }
        if (iVar1 < srcLimit) {
          iVar3 = iVar1 + 1;
          uVar12 = (uint)(ushort)src[iVar1];
          if ((((uVar12 & 0xfc00) == 0xd800) && (iVar3 != srcLimit)) &&
             (lVar10 = (long)iVar3, ((ushort)src[lVar10] & 0xfc00) == 0xdc00)) {
            iVar3 = iVar1 + 2;
            uVar12 = (uint)(ushort)src[iVar1] * 0x400 + (uint)(ushort)src[lVar10] + 0xfca02400;
          }
          iVar13 = iVar1;
          if ((options >> 9 & 1) == 0) {
LAB_002ffd0b:
            iVar4 = iVar3;
            iVar3 = iVar4;
            if ((options >> 10 & 1) == 0) {
              bVar2 = u_charType_63(uVar12);
              if ((0xf020e2eU >> (bVar2 & 0x1f) & 1) != 0) goto LAB_002ffda0;
              if (bVar2 == 4) goto LAB_002ffd2e;
            }
            else {
LAB_002ffd2e:
              iVar5 = ucase_getType_63(uVar12);
              if (iVar5 != 0) goto LAB_002ffda0;
            }
            iVar13 = srcLimit;
            iVar3 = srcLimit;
            if (iVar4 == srcLimit) goto LAB_002ffda0;
            iVar3 = iVar4 + 1;
            uVar12 = (uint)(ushort)src[iVar4];
            iVar13 = iVar4;
            if ((((uVar12 & 0xfc00) == 0xd800) && (iVar3 != srcLimit)) &&
               (((ushort)src[iVar3] & 0xfc00) == 0xdc00)) {
              uVar12 = uVar12 * 0x400 + (uint)(ushort)src[iVar3] + 0xfca02400;
              iVar3 = iVar4 + 2;
            }
            goto LAB_002ffd0b;
          }
          goto LAB_002ffe18;
        }
        pUVar8 = (UCaseContext *)((ulong)pUVar7 & 0xffffffff);
        iVar3 = srcLimit;
LAB_00300076:
        iVar5 = (int32_t)pUVar8;
        lVar10 = 0x68;
        pUVar7 = pUVar8;
      } while (srcLimit <= iVar1);
    }
  }
  return iVar5;
LAB_002ffda0:
  uVar11 = iVar13 - iVar1;
  if (uVar11 != 0 && iVar1 <= iVar13) {
    uVar6 = (uint)local_98;
    uVar9 = uVar6;
    if (uVar11 != 0 && iVar1 <= iVar13) {
      if (edits != (Edits *)0x0) {
        icu_63::Edits::addUnchanged(edits,uVar11);
      }
      if ((options >> 0xe & 1) == 0) {
        if ((uVar6 ^ 0x7fffffff) < uVar11) goto LAB_0030009c;
        uVar9 = uVar11 + uVar6;
        if ((int)uVar9 <= destCapacity) {
          u_memcpy_63(dest + (int)uVar6,src + iVar1,uVar11);
        }
      }
    }
    local_98 = (UCaseContext *)(ulong)uVar9;
    if ((int)uVar9 < 0) goto LAB_0030009c;
  }
LAB_002ffe18:
  if (iVar3 - iVar13 == 0 || iVar3 < iVar13) goto LAB_00300041;
  local_50.cpStart = iVar13;
  local_50.cpLimit = iVar3;
  iVar5 = ucase_toFullTitle_63
                    (uVar12,icu_63::anon_unknown_10::utf16_caseContextIterator,&local_50,&s,
                     caseLocale);
  uVar12 = icu_63::anon_unknown_10::appendResult
                     (dest,(int32_t)local_98,destCapacity,iVar5,s,iVar3 - iVar13,options,edits);
  pUVar8 = (UCaseContext *)(ulong)uVar12;
  if ((int)uVar12 < 0) goto LAB_0030009c;
  if (((caseLocale == 5) && (iVar13 + 1 < srcLimit)) && ((UChar)(src[iVar13] | 0x20U) == 0x69)) {
    if (src[iVar13 + 1] == L'J') {
      if (edits != (Edits *)0x0) {
        icu_63::Edits::addUnchanged(edits,1);
      }
      if ((options >> 0xe & 1) == 0) {
        if (uVar12 == 0x7fffffff) goto LAB_0030009c;
        if ((int)uVar12 < destCapacity) {
          u_memcpy_63(dest + uVar12,src + (long)iVar13 + 1,1);
        }
        pUVar8 = (UCaseContext *)(ulong)(uVar12 + 1);
      }
    }
    else {
      if (src[iVar13 + 1] != L'j') goto LAB_002fff63;
      if ((int)uVar12 < destCapacity) {
        dest[uVar12] = L'J';
      }
      else if (uVar12 == 0x7fffffff) goto LAB_0030009c;
      if (edits != (Edits *)0x0) {
        icu_63::Edits::addReplace(edits,1,1);
      }
      pUVar8 = (UCaseContext *)(ulong)(uVar12 + 1);
    }
    iVar3 = iVar3 + 1;
  }
LAB_002fff63:
  local_98 = pUVar8;
  if (iVar3 < srcLimit) {
    uVar12 = (uint)pUVar8;
    if ((options >> 8 & 1) == 0) {
      iVar5 = icu_63::anon_unknown_10::toLower
                        (caseLocale,options,dest + (long)pUVar8,destCapacity - uVar12,src,&local_50,
                         iVar3,srcLimit,edits,errorCode);
      pUVar8 = (UCaseContext *)(ulong)(iVar5 + uVar12);
      local_98 = pUVar8;
      if (*errorCode == U_BUFFER_OVERFLOW_ERROR) {
        *errorCode = U_ZERO_ERROR;
      }
      else {
        iVar3 = iVar1;
        if (U_ZERO_ERROR < *errorCode) goto LAB_00300076;
      }
    }
    else {
      uVar11 = srcLimit - iVar3;
      if (uVar11 != 0 && iVar3 <= srcLimit) {
        if (edits != (Edits *)0x0) {
          icu_63::Edits::addUnchanged(edits,uVar11);
        }
        if ((options >> 0xe & 1) == 0) {
          if ((uVar12 ^ 0x7fffffff) < uVar11) {
LAB_0030009c:
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
          }
          uVar12 = uVar11 + uVar12;
          local_98 = (UCaseContext *)(ulong)uVar12;
          if ((int)uVar12 <= destCapacity) {
            u_memcpy_63(dest + (long)pUVar8,src + iVar3,uVar11);
          }
        }
      }
    }
  }
LAB_00300041:
  lVar10 = 0x68;
  iVar1 = srcLimit;
  goto joined_r0x002ffc70;
}

Assistant:

U_CFUNC int32_t U_CALLCONV
ustrcase_internalToTitle(int32_t caseLocale, uint32_t options, BreakIterator *iter,
                         UChar *dest, int32_t destCapacity,
                         const UChar *src, int32_t srcLength,
                         icu::Edits *edits,
                         UErrorCode &errorCode) {
    if (!ustrcase_checkTitleAdjustmentOptions(options, errorCode)) {
        return 0;
    }

    /* set up local variables */
    UCaseContext csc=UCASECONTEXT_INITIALIZER;
    csc.p=(void *)src;
    csc.limit=srcLength;
    int32_t destIndex=0;
    int32_t prev=0;
    UBool isFirstIndex=TRUE;

    /* titlecasing loop */
    while(prev<srcLength) {
        /* find next index where to titlecase */
        int32_t index;
        if(isFirstIndex) {
            isFirstIndex=FALSE;
            index=iter->first();
        } else {
            index=iter->next();
        }
        if(index==UBRK_DONE || index>srcLength) {
            index=srcLength;
        }

        /*
         * Segment [prev..index[ into 3 parts:
         * a) skipped characters (copy as-is) [prev..titleStart[
         * b) first letter (titlecase)              [titleStart..titleLimit[
         * c) subsequent characters (lowercase)                 [titleLimit..index[
         */
        if(prev<index) {
            // Find and copy skipped characters [prev..titleStart[
            int32_t titleStart=prev;
            int32_t titleLimit=prev;
            UChar32 c;
            U16_NEXT(src, titleLimit, index, c);
            if ((options&U_TITLECASE_NO_BREAK_ADJUSTMENT)==0) {
                // Adjust the titlecasing index to the next cased character,
                // or to the next letter/number/symbol/private use.
                // Stop with titleStart<titleLimit<=index
                // if there is a character to be titlecased,
                // or else stop with titleStart==titleLimit==index.
                UBool toCased = (options&U_TITLECASE_ADJUST_TO_CASED) != 0;
                while (toCased ? UCASE_NONE==ucase_getType(c) : !ustrcase_isLNS(c)) {
                    titleStart=titleLimit;
                    if(titleLimit==index) {
                        break;
                    }
                    U16_NEXT(src, titleLimit, index, c);
                }
                if (prev < titleStart) {
                    destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                              src+prev, titleStart-prev, options, edits);
                    if(destIndex<0) {
                        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                        return 0;
                    }
                }
            }

            if(titleStart<titleLimit) {
                /* titlecase c which is from [titleStart..titleLimit[ */
                csc.cpStart=titleStart;
                csc.cpLimit=titleLimit;
                const UChar *s;
                c=ucase_toFullTitle(c, utf16_caseContextIterator, &csc, &s, caseLocale);
                destIndex=appendResult(dest, destIndex, destCapacity, c, s,
                                       titleLimit-titleStart, options, edits);
                if(destIndex<0) {
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }

                /* Special case Dutch IJ titlecasing */
                if (titleStart+1 < index &&
                        caseLocale == UCASE_LOC_DUTCH &&
                        (src[titleStart] == 0x0049 || src[titleStart] == 0x0069)) {
                    if (src[titleStart+1] == 0x006A) {
                        destIndex=appendUChar(dest, destIndex, destCapacity, 0x004A);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                        if(edits!=NULL) {
                            edits->addReplace(1, 1);
                        }
                        titleLimit++;
                    } else if (src[titleStart+1] == 0x004A) {
                        // Keep the capital J from getting lowercased.
                        destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                                  src+titleStart+1, 1, options, edits);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                        titleLimit++;
                    }
                }

                /* lowercase [titleLimit..index[ */
                if(titleLimit<index) {
                    if((options&U_TITLECASE_NO_LOWERCASE)==0) {
                        /* Normal operation: Lowercase the rest of the word. */
                        destIndex+=
                            toLower(
                                caseLocale, options,
                                dest+destIndex, destCapacity-destIndex,
                                src, &csc, titleLimit, index,
                                edits, errorCode);
                        if(errorCode==U_BUFFER_OVERFLOW_ERROR) {
                            errorCode=U_ZERO_ERROR;
                        }
                        if(U_FAILURE(errorCode)) {
                            return destIndex;
                        }
                    } else {
                        /* Optionally just copy the rest of the word unchanged. */
                        destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                                  src+titleLimit, index-titleLimit, options, edits);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                    }
                }
            }
        }

        prev=index;
    }

    return checkOverflowAndEditsError(destIndex, destCapacity, edits, errorCode);
}